

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-01.cpp
# Opt level: O1

int __thiscall
baryonyx::itm::
solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  long lVar1;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar2;
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> ht;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_58;
  _Head_base<0UL,_int_*,_false> local_50;
  longdouble local_48;
  longdouble local_3c;
  
  if (begin == end) {
    lVar1 = 0;
  }
  else {
    lVar1 = 0;
    do {
      sparse_matrix<int>::column((sparse_matrix<int> *)&local_58,(int)this + 0x10);
      local_48 = (longdouble)0;
      local_3c = local_48;
      lVar2 = in_ST5;
      if ((tuple<int_*,_std::default_delete<int[]>_>)local_50._M_head_impl !=
          (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
          local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        local_3c = (longdouble)0;
        local_48 = local_3c;
        do {
          local_48 = (this->pi)._M_t.
                     super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                     super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                     super__Head_base<0UL,_long_double_*,_false>._M_head_impl
                     [*(local_50._M_head_impl + 4)] + local_48;
          local_3c = (this->P)._M_t.
                     super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                     super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                     super__Head_base<0UL,_long_double_*,_false>._M_head_impl
                     [*local_50._M_head_impl] + local_3c;
          local_50._M_head_impl = local_50._M_head_impl + 8;
          lVar2 = in_ST4;
        } while ((tuple<int_*,_std::default_delete<int[]>_>)local_50._M_head_impl !=
                 (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
                 local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
      }
      (this->R)._M_t.
      super___uniq_ptr_impl<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
      .
      super__Head_base<0UL,_baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_false>
      ._M_head_impl[lVar1].id = (int)lVar1;
      in_ST5 = lVar2;
      quadratic_cost_type<long_double>::operator()
                ((longdouble *)this->c,
                 (quadratic_cost_type<long_double> *)(ulong)(uint)begin->column,(int)x,
                 (bit_array *)
                 local_58._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
      (this->R)._M_t.
      super___uniq_ptr_impl<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
      .
      super__Head_base<0UL,_baryonyx::itm::solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_false>
      ._M_head_impl[lVar1].value = (in_ST0 - local_48) - local_3c;
      lVar1 = lVar1 + 1;
      begin = begin + 1;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = lVar2;
    } while (begin != end);
  }
  return (int)lVar1;
}

Assistant:

int compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                              sparse_matrix<int>::row_iterator end,
                              const Xtype& x) noexcept
    {
        int r_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi = 0;
            Float sum_a_p = 0;

            auto ht = ap.column(begin->column);

            for (; std::get<0>(ht) != std::get<1>(ht); ++std::get<0>(ht)) {
                sum_a_pi += pi[std::get<0>(ht)->row];
                sum_a_p += P[std::get<0>(ht)->value];
            }

            R[r_size].id = r_size;
            R[r_size].value = c(begin->column, x) - sum_a_pi - sum_a_p;

            ++r_size;
        }

        return r_size;
    }